

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::draw_range_elements_base_vertex_invalid_map
               (NegativeTestContext *ctx)

{
  allocator<char> local_39;
  string local_38;
  undefined1 local_18 [4];
  GLuint local_14;
  GLfloat vertices [1];
  GLuint buf;
  NegativeTestContext *ctx_local;
  
  local_14 = 0;
  _vertices = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_OPERATION is generated if a non-zero buffer object name is bound to an enabled array or the element array and the buffer object\'s data store is currently mapped."
             ,&local_39);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glGenBuffers(&_vertices->super_CallLogWrapper,1,&local_14);
  glu::CallLogWrapper::glBindBuffer(&_vertices->super_CallLogWrapper,0x8893,local_14);
  glu::CallLogWrapper::glBufferData(&_vertices->super_CallLogWrapper,0x8893,10,(void *)0x0,0x88e4);
  glu::CallLogWrapper::glMapBufferRange(&_vertices->super_CallLogWrapper,0x8893,0,5,1);
  NegativeTestContext::expectError(_vertices,0);
  glu::CallLogWrapper::glDrawRangeElementsBaseVertex
            (&_vertices->super_CallLogWrapper,0,0,1,1,0x1405,local_18,1);
  NegativeTestContext::expectError(_vertices,0x502);
  glu::CallLogWrapper::glUnmapBuffer(&_vertices->super_CallLogWrapper,0x8893);
  glu::CallLogWrapper::glDeleteBuffers(&_vertices->super_CallLogWrapper,1,&local_14);
  NegativeTestContext::endSection(_vertices);
  return;
}

Assistant:

void draw_range_elements_base_vertex_invalid_map (NegativeTestContext& ctx)
{
	GLuint	buf		= 0;
	GLfloat	vertices[1];

	ctx.beginSection("GL_INVALID_OPERATION is generated if a non-zero buffer object name is bound to an enabled array or the element array and the buffer object's data store is currently mapped.");
	ctx.glGenBuffers(1, &buf);
	ctx.glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, buf);
	ctx.glBufferData(GL_ELEMENT_ARRAY_BUFFER, 10, 0, GL_STATIC_DRAW);
	ctx.glMapBufferRange(GL_ELEMENT_ARRAY_BUFFER, 0, 5, GL_MAP_READ_BIT);
	ctx.expectError(GL_NO_ERROR);
	ctx.glDrawRangeElementsBaseVertex(GL_POINTS, 0, 1, 1, GL_UNSIGNED_INT, vertices, 1);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUnmapBuffer(GL_ELEMENT_ARRAY_BUFFER);
	ctx.glDeleteBuffers(1, &buf);
	ctx.endSection();
}